

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  uchar uVar1;
  int iVar2;
  uchar *p;
  uchar *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *puVar8;
  size_t __n;
  uint8 *pScan_line;
  uint scan_line_len;
  jpeg_decoder decoder;
  uchar *local_35a8;
  ulong local_35a0;
  long local_3598;
  uint local_358c;
  jpeg_decoder local_3588;
  
  if ((actual_comps == (int *)0x0) ||
     (*actual_comps = 0,
     (req_comps == 0 || height == (int *)0x0) ||
     (width == (int *)0x0 || pStream == (jpeg_decoder_stream *)0x0))) {
    return (uchar *)0x0;
  }
  if (4 < (uint)req_comps) {
    return (uchar *)0x0;
  }
  if ((0x1aU >> (req_comps & 0x1fU) & 1) == 0) {
    return (uchar *)0x0;
  }
  jpeg_decoder::jpeg_decoder(&local_3588,pStream);
  if (local_3588.m_error_code == JPGD_SUCCESS) {
    uVar4 = (ulong)(uint)local_3588.m_image_x_size;
    local_35a0 = (ulong)(uint)local_3588.m_image_y_size;
    *width = local_3588.m_image_x_size;
    *height = local_3588.m_image_y_size;
    *actual_comps = local_3588.m_comps_in_frame;
    iVar2 = jpeg_decoder::begin_decoding(&local_3588);
    if (iVar2 == 0) {
      p = (uchar *)crnlib::crnlib_malloc
                             ((long)(local_3588.m_image_x_size * req_comps * (int)local_35a0));
      if (p != (uchar *)0x0) {
        if (0 < (int)local_35a0) {
          __n = (size_t)(local_3588.m_image_x_size * req_comps);
          local_3598 = uVar4 * 3;
          uVar7 = 0;
          puVar8 = p;
          do {
            iVar2 = jpeg_decoder::decode(&local_3588,&local_35a8,&local_358c);
            if (iVar2 == 0) {
              if (((req_comps == 1) && (local_3588.m_comps_in_frame == 1)) ||
                 ((req_comps == 4 && (local_3588.m_comps_in_frame == 3)))) {
                memcpy(p + uVar7 * __n,local_35a8,__n);
              }
              else if (local_3588.m_comps_in_frame == 3) {
                if (req_comps == 1) {
                  if (0 < local_3588.m_image_x_size) {
                    uVar6 = 0;
                    do {
                      puVar8[uVar6] =
                           (uchar)((uint)local_35a8[uVar6 * 4 + 2] * 0x1d2f +
                                   (uint)local_35a8[uVar6 * 4 + 1] * 0x9646 +
                                   (uint)local_35a8[uVar6 * 4] * 0x4c8b + 0x8000 >> 0x10);
                      uVar6 = uVar6 + 1;
                    } while (uVar4 != uVar6);
                  }
                }
                else if (0 < local_3588.m_image_x_size) {
                  puVar3 = local_35a8 + 2;
                  lVar5 = 0;
                  do {
                    puVar8[lVar5] = puVar3[-2];
                    puVar8[lVar5 + 1] = puVar3[-1];
                    puVar8[lVar5 + 2] = *puVar3;
                    puVar3 = puVar3 + 4;
                    lVar5 = lVar5 + 3;
                  } while (local_3598 != lVar5);
                }
              }
              else if (local_3588.m_comps_in_frame == 1) {
                if (req_comps == 3) {
                  if (0 < local_3588.m_image_x_size) {
                    lVar5 = 0;
                    puVar3 = local_35a8;
                    do {
                      uVar1 = *puVar3;
                      puVar8[lVar5] = uVar1;
                      puVar8[lVar5 + 1] = uVar1;
                      puVar8[lVar5 + 2] = uVar1;
                      puVar3 = puVar3 + 1;
                      lVar5 = lVar5 + 3;
                    } while (local_3598 != lVar5);
                  }
                }
                else if (0 < local_3588.m_image_x_size) {
                  uVar6 = 0;
                  do {
                    uVar1 = local_35a8[uVar6];
                    puVar8[uVar6 * 4] = uVar1;
                    puVar8[uVar6 * 4 + 1] = uVar1;
                    puVar8[uVar6 * 4 + 2] = uVar1;
                    puVar8[uVar6 * 4 + 3] = 0xff;
                    uVar6 = uVar6 + 1;
                  } while (uVar4 != uVar6);
                }
              }
            }
            else {
              crnlib::crnlib_free(p);
            }
            if (iVar2 != 0) goto LAB_0011fe1d;
            uVar7 = uVar7 + 1;
            puVar8 = puVar8 + __n;
          } while (uVar7 != local_35a0);
        }
        goto LAB_0011fe1f;
      }
    }
  }
LAB_0011fe1d:
  p = (uchar *)0x0;
LAB_0011fe1f:
  jpeg_decoder::~jpeg_decoder(&local_3588);
  return p;
}

Assistant:

unsigned char* decompress_jpeg_image_from_stream(jpeg_decoder_stream* pStream, int* width, int* height, int* actual_comps, int req_comps) {
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8* pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++) {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS) {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8* pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1) {
      if (req_comps == 3) {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    } else if (decoder.get_num_components() == 3) {
      if (req_comps == 1) {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++) {
          int r = pScan_line[x * 4 + 0];
          int g = pScan_line[x * 4 + 1];
          int b = pScan_line[x * 4 + 2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          pDst[0] = pScan_line[x * 4 + 0];
          pDst[1] = pScan_line[x * 4 + 1];
          pDst[2] = pScan_line[x * 4 + 2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}